

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O2

void __thiscall
omp_enumerate_container_iterator_types_Test::TestBody
          (omp_enumerate_container_iterator_types_Test *this)

{
  initializer_list<int> __l;
  allocator_type local_49;
  AssertionResult gtest_ar_;
  vector<int,_std::allocator<int>_> v;
  
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0x2000000;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x400000003;
  __l._M_len = 5;
  __l._M_array = (iterator)&gtest_ar_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v.super__Vector_base<int,_std::allocator<int>_>,
             __l,&local_49);
  gtest_ar_.success_ = true;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(omp_enumerate, container_iterator_types) {
  std::vector v = {1, 2, 3, 4, 5};

  auto e_is_iterator_1 = std::is_same_v<typename std::vector<int>::iterator,
                                        typename decltype(omp::enumerate(
                                            v))::iterator::wrapped_iterator>;

  auto e_is_citerator_1 =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(
                         std::as_const(v)))::iterator::wrapped_iterator>;

  auto e_is_iterator_2 =
      std::is_same_v<typename std::vector<int>::iterator,
                     typename decltype(omp::enumerate(
                         std::move(v)))::iterator::wrapped_iterator>;

  auto e_is_citerator_2 =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(std::move(
                         std::as_const(v))))::iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_iterator_1 && e_is_citerator_1 && e_is_iterator_2 &&
              e_is_citerator_2);

  auto e_is_citerator =
      std::is_same_v<typename std::vector<int>::const_iterator,
                     typename decltype(omp::enumerate(
                         v))::const_iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_citerator);
}